

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdm.hpp
# Opt level: O0

void __thiscall
wdm::Indep_test::Indep_test
          (Indep_test *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,string *method,
          vector<double,_std::allocator<double>_> *weights,bool remove_missing,string *alternative)

{
  byte bVar1;
  string *in_RCX;
  vector<double,_std::allocator<double>_> *in_RSI;
  string *in_RDI;
  Indep_test *this_00;
  double dVar2;
  string *in_stack_00000008;
  bool in_stack_0000007f;
  string *in_stack_00000080;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  vector<double,_std::allocator<double>_> *in_stack_00000098;
  bool in_stack_0000010f;
  vector<double,_std::allocator<double>_> *in_stack_00000110;
  string *in_stack_00000118;
  vector<double,_std::allocator<double>_> *in_stack_00000120;
  vector<double,_std::allocator<double>_> *in_stack_00000128;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe60;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  string *method_00;
  string local_148 [32];
  string local_128 [32];
  string local_108 [56];
  string local_d0 [80];
  string local_80 [16];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  Indep_test *in_stack_ffffffffffffffc0;
  
  method_00 = in_RDI;
  std::__cxx11::string::string(in_RDI,in_RCX);
  this_00 = (Indep_test *)(method_00 + 0x20);
  std::__cxx11::string::string((string *)this_00,in_stack_00000008);
  utils::check_sizes((vector<double,_std::allocator<double>_> *)
                     CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::__cxx11::string::string(local_80,in_RCX);
  utils::preproc(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
                 in_stack_0000007f);
  bVar1 = std::operator==(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string(local_80);
  if ((bVar1 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    dVar2 = utils::effective_sample_size
                      ((size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    *(double *)(in_RDI + 0x40) = dVar2;
    std::vector<double,_std::allocator<double>_>::vector
              (in_RSI,(vector<double,_std::allocator<double>_> *)in_RCX);
    std::vector<double,_std::allocator<double>_>::vector
              (in_RSI,(vector<double,_std::allocator<double>_> *)in_RCX);
    std::__cxx11::string::string(local_d0,in_RCX);
    std::vector<double,_std::allocator<double>_>::vector
              (in_RSI,(vector<double,_std::allocator<double>_> *)in_RCX);
    dVar2 = wdm(in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
                in_stack_0000010f);
    *(double *)(in_RDI + 0x48) = dVar2;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_d0);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe50);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe50);
    std::__cxx11::string::string(local_108,in_RCX);
    dVar2 = compute_test_stat(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                              in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                              in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90);
    *(double *)(in_RDI + 0x50) = dVar2;
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::string(local_128,in_RCX);
    std::__cxx11::string::string(local_148,in_stack_00000008);
    dVar2 = compute_p_value(this_00,(double)in_stack_00000008,(string *)method_00,(string *)in_RDI,
                            (double)in_RSI);
    *(double *)((string *)in_RDI + 0x58) = dVar2;
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_128);
  }
  else {
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    dVar2 = utils::effective_sample_size
                      ((size_t)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    *(double *)(in_RDI + 0x40) = dVar2;
    dVar2 = std::numeric_limits<double>::quiet_NaN();
    *(double *)(in_RDI + 0x48) = dVar2;
    dVar2 = std::numeric_limits<double>::quiet_NaN();
    *(double *)(in_RDI + 0x50) = dVar2;
    dVar2 = std::numeric_limits<double>::quiet_NaN();
    *(double *)(in_RDI + 0x58) = dVar2;
  }
  return;
}

Assistant:

Indep_test(std::vector<double> x,
               std::vector<double> y,
               std::string method,
               std::vector<double> weights = std::vector<double>(),
               bool remove_missing = true,
               std::string alternative = "two-sided") :
        method_(method),
        alternative_(alternative)
    {
        utils::check_sizes(x, y, weights);
        if (utils::preproc(x, y, weights, method, remove_missing) == "return_nan") {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_  = std::numeric_limits<double>::quiet_NaN();
            statistic_ = std::numeric_limits<double>::quiet_NaN();
            p_value_   = std::numeric_limits<double>::quiet_NaN();
        } else {
            n_eff_ = utils::effective_sample_size(x.size(), weights);
            estimate_ = wdm(x, y, method, weights, false);
            statistic_ = compute_test_stat(estimate_, method, n_eff_, x, y, weights);
            p_value_ = compute_p_value(statistic_, method, alternative, n_eff_);
        }
    }